

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void checkPropertyConsistency<bool>
               (cmGeneratorTarget *depender,cmGeneratorTarget *dependee,string *propName,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emitted,string *config,CompatibleType t,bool *param_7)

{
  pointer pcVar1;
  cmLocalGenerator *this;
  bool bVar2;
  cmValue cVar3;
  string *psVar4;
  long *plVar5;
  ostream *poVar6;
  char *pcVar7;
  pointer __v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view str;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  string pname;
  cmList props;
  string pdir;
  ostringstream e;
  string local_260;
  string *local_240;
  cmGeneratorTarget *local_238;
  string local_230;
  cmGeneratorTarget *local_210;
  string *local_208;
  cmList local_200;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  char *local_188;
  undefined8 local_180;
  ios_base local_138 [264];
  
  local_238 = depender;
  local_208 = config;
  cVar3 = cmGeneratorTarget::GetProperty(dependee,propName);
  if (cVar3.Value != (string *)0x0) {
    local_1a8._0_8_ = &local_198;
    pcVar1 = ((cVar3.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,pcVar1,pcVar1 + (cVar3.Value)->_M_string_length);
    init._M_len = 1;
    init._M_array = (iterator)local_1a8;
    cmList::cmList(&local_200,init);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
    }
    local_240 = propName;
    local_210 = dependee;
    psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    local_1a8._8_8_ = (psVar4->_M_dataplus)._M_p;
    local_1a8._0_8_ = psVar4->_M_string_length;
    local_198._M_allocated_capacity = 0;
    local_198._8_8_ = 0xf;
    pcVar7 = "/Help/prop_tgt/";
    local_188 = "/Help/prop_tgt/";
    local_180 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_1a8;
    cmCatViews(&local_1c8,views);
    if (local_200.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_200.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __v = local_200.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        str._M_str = pcVar7;
        str._M_len = (size_t)(__v->_M_dataplus)._M_p;
        cmSystemTools::HelpFileName_abi_cxx11_
                  (&local_230,(cmSystemTools *)__v->_M_string_length,str);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,&local_1c8,&local_230);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_1a8);
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        pcVar7 = (char *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar7) {
          local_260.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
          local_260.field_2._8_8_ = plVar5[3];
        }
        else {
          local_260.field_2._M_allocated_capacity = *(undefined8 *)pcVar7;
          local_260._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_260._M_string_length = plVar5[1];
        *plVar5 = (long)pcVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
        bVar2 = cmsys::SystemTools::FileExists(&local_260,true);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
          psVar4 = cmTarget::GetName_abi_cxx11_(local_210->Target);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,
                              psVar4->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" has property \"",0x10);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(__v->_M_dataplus)._M_p,__v->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" listed in its ",0x10);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(local_240->_M_dataplus)._M_p,local_240->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     " property.  This is not allowed.  Only user-defined properties may appear listed in the "
                     ,0x58);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(local_240->_M_dataplus)._M_p,local_240->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," property.",10);
          this = local_238->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
LAB_0059b921:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        pVar8 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)emitted,__v);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar7 = "FALSE";
          checkInterfacePropertyCompatibility<bool>
                    (local_238,__v,local_208,"FALSE",BoolType,(bool *)0x0);
          if (((cmSystemTools::s_ErrorOccurred != false) ||
              (cmSystemTools::s_FatalErrorOccurred != false)) ||
             (bVar2 = cmSystemTools::GetInterruptFlag(), bVar2)) goto LAB_0059b921;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        __v = __v + 1;
      } while (__v != local_200.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_200.Values);
  }
  return;
}

Assistant:

void checkPropertyConsistency(cmGeneratorTarget const* depender,
                              cmGeneratorTarget const* dependee,
                              const std::string& propName,
                              std::set<std::string>& emitted,
                              const std::string& config, CompatibleType t,
                              PropertyType* /*unused*/)
{
  cmValue prop = dependee->GetProperty(propName);
  if (!prop) {
    return;
  }

  cmList props{ *prop };
  std::string pdir =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Help/prop_tgt/");

  for (std::string const& p : props) {
    std::string pname = cmSystemTools::HelpFileName(p);
    std::string pfile = pdir + pname + ".rst";
    if (cmSystemTools::FileExists(pfile, true)) {
      std::ostringstream e;
      e << "Target \"" << dependee->GetName() << "\" has property \"" << p
        << "\" listed in its " << propName
        << " property.  "
           "This is not allowed.  Only user-defined properties may appear "
           "listed in the "
        << propName << " property.";
      depender->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                                  e.str());
      return;
    }
    if (emitted.insert(p).second) {
      getLinkInterfaceDependentProperty<PropertyType>(depender, p, config, t,
                                                      nullptr);
      if (cmSystemTools::GetErrorOccurredFlag()) {
        return;
      }
    }
  }
}